

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQGenerator::Kill(SQGenerator *this)

{
  SQObjectPtr local_20;
  SQGenerator *local_10;
  SQGenerator *this_local;
  
  this->_state = eDead;
  local_10 = this;
  ::SQObjectPtr::SQObjectPtr(&local_20);
  sqvector<SQObjectPtr>::resize(&this->_stack,0,&local_20);
  ::SQObjectPtr::~SQObjectPtr(&local_20);
  ::SQObjectPtr::Null(&this->_closure);
  return;
}

Assistant:

void Kill(){
        _state=eDead;
        _stack.resize(0);
        _closure.Null();}